

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

bool __thiscall
HighsSymmetryDetection::splitCell(HighsSymmetryDetection *this,HighsInt cell,HighsInt splitPoint)

{
  pointer piVar1;
  pointer puVar2;
  pointer puVar3;
  iterator __position;
  iterator __position_00;
  u32 uVar4;
  u32 uVar5;
  undefined8 in_RAX;
  int iVar6;
  int iVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  u32 certificateVal;
  undefined8 local_28;
  
  local_28._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  local_28 = CONCAT44(local_28._4_4_,splitPoint);
  uVar4 = getVertexHash(this,(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[splitPoint]);
  uVar5 = getVertexHash(this,(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[cell]);
  piVar1 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_28._4_4_ =
       (uint)(((ulong)(uint)((int)local_28 - cell) + 0x7e92251dec62835e) *
              ((local_28 & 0xffffffff) + 0xa94e9c75f80ad6de) +
              ((ulong)(uint)(piVar1[cell] - (int)local_28) + 0x8a183895eeac1536) *
              ((ulong)(uint)cell + 0x42d8680e260ae5b) +
              ((ulong)uVar5 + 0x80c8963be3e4c2f3) * ((ulong)uVar4 + 0xc8497d2a400d9551) >> 0x20);
  puVar2 = (this->firstLeaveCertificate).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (this->firstLeaveCertificate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    puVar3 = (this->currNodeCertificate).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->currNodeCertificate).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar3;
    iVar7 = (int)(uVar10 >> 2);
    iVar6 = (uint)(*(uint *)((long)puVar2 + uVar10) == local_28._4_4_ &&
                  this->firstLeavePrefixLen == iVar7) + this->firstLeavePrefixLen;
    this->firstLeavePrefixLen = iVar6;
    puVar2 = (this->bestLeaveCertificate).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = (uint)(local_28._4_4_ == *(uint *)((long)puVar2 + uVar10) &&
                  this->bestLeavePrefixLen == iVar7) + this->bestLeavePrefixLen;
    this->bestLeavePrefixLen = iVar9;
    if ((iVar6 <= iVar7) && (iVar9 <= iVar7)) {
      puVar8 = (uint *)((long)&local_28 + 4);
      if (iVar9 != iVar7) {
        puVar8 = puVar3 + iVar9;
      }
      if (puVar2[iVar9] < *puVar8) {
        return false;
      }
    }
  }
  piVar1[(int)local_28] = piVar1[cell];
  piVar1[cell] = (int)local_28;
  __position._M_current =
       (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->cellCreationStack,__position,
               (int *)&local_28);
  }
  else {
    *__position._M_current = (int)local_28;
    (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->currNodeCertificate,
               __position_00,(uint *)((long)&local_28 + 4));
  }
  else {
    *__position_00._M_current = local_28._4_4_;
    (this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return true;
}

Assistant:

bool HighsSymmetryDetection::splitCell(HighsInt cell, HighsInt splitPoint) {
  u32 hSplit = getVertexHash(currentPartition[splitPoint]);
  u32 hCell = getVertexHash(currentPartition[cell]);

  u32 certificateVal =
      (HighsHashHelpers::pair_hash<0>(hSplit, hCell) +
       HighsHashHelpers::pair_hash<1>(
           cell, currentPartitionLinks[cell] - splitPoint) +
       HighsHashHelpers::pair_hash<2>(splitPoint, splitPoint - cell)) >>
      32;

  // employ prefix pruning scheme as in bliss
  if (!firstLeaveCertificate.empty()) {
    firstLeavePrefixLen +=
        (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size()) *
        (certificateVal == firstLeaveCertificate[currNodeCertificate.size()]);
    bestLeavePrefixLen +=
        (bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()) *
        (certificateVal == bestLeaveCertificate[currNodeCertificate.size()]);

    // if the node certificate is not a prefix of the first leave's certificate
    // and it comes lexicographically after the certificate value of the
    // lexicographically smallest leave certificate we prune the node
    if (firstLeavePrefixLen <= (HighsInt)currNodeCertificate.size() &&
        bestLeavePrefixLen <= (HighsInt)currNodeCertificate.size()) {
      u32 diffVal = bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()
                        ? certificateVal
                        : currNodeCertificate[bestLeavePrefixLen];
      if (diffVal > bestLeaveCertificate[bestLeavePrefixLen]) return false;
    }
  }

  currentPartitionLinks[splitPoint] = currentPartitionLinks[cell];
  currentPartitionLinks[cell] = splitPoint;
  cellCreationStack.push_back(splitPoint);
  currNodeCertificate.push_back(certificateVal);

  return true;
}